

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unisetspan.cpp
# Opt level: O0

void __thiscall icu_63::OffsetList::shift(OffsetList *this,int32_t delta)

{
  int local_18;
  int32_t i;
  int32_t delta_local;
  OffsetList *this_local;
  
  local_18 = this->start + delta;
  if (this->capacity <= local_18) {
    local_18 = local_18 - this->capacity;
  }
  if (this->list[local_18] != '\0') {
    this->list[local_18] = '\0';
    this->length = this->length + -1;
  }
  this->start = local_18;
  return;
}

Assistant:

void shift(int32_t delta) {
        int32_t i=start+delta;
        if(i>=capacity) {
            i-=capacity;
        }
        if(list[i]) {
            list[i]=FALSE;
            --length;
        }
        start=i;
    }